

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

void udiv_urem_bv(BtorSimBitVector *a,BtorSimBitVector *b,BtorSimBitVector **q,BtorSimBitVector **r)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *b_01;
  uint uVar5;
  ulong value;
  long lVar6;
  ulong value_00;
  ulong uVar7;
  uint uVar8;
  BtorSimBitVector *local_58;
  
  if (a->width < 0x41) {
    uVar5 = a->len;
    uVar3 = (ulong)uVar5;
    if (uVar3 == 0) {
      value = 0;
    }
    else {
      lVar6 = 0;
      value = 0;
      do {
        uVar5 = uVar5 - 1;
        value = value | (ulong)*(uint *)((long)&a[1].width + lVar6) << ((char)uVar5 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar3 << 2 != lVar6);
    }
    uVar5 = b->len;
    uVar3 = (ulong)uVar5;
    value_00 = 0xffffffffffffffff;
    if (uVar3 != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar5 = uVar5 - 1;
        uVar7 = uVar7 | (ulong)*(uint *)((long)&b[1].width + lVar6) << ((char)uVar5 * ' ' & 0x3fU);
        lVar6 = lVar6 + 4;
      } while (uVar3 << 2 != lVar6);
      if (uVar7 != 0) {
        value_00 = value / uVar7;
        value = value % uVar7;
      }
    }
    local_58 = btorsim_bv_uint64_to_bv(value_00,a->width);
    b_01 = btorsim_bv_uint64_to_bv(value,a->width);
  }
  else {
    b_00 = btorsim_bv_neg(b);
    local_58 = btorsim_bv_new(a->width);
    pBVar4 = btorsim_bv_new(a->width);
    uVar3 = (ulong)(a->width - 1);
    do {
      b_01 = sll_bv(pBVar4,1);
      free(pBVar4);
      uVar8 = ~((uint)(uVar3 >> 5) & 0x7ffffff);
      uVar5 = b_01->len - 1;
      (&b_01[1].width)[uVar5] =
           (uint)(((&a[1].width)[a->len + uVar8] >> ((uint)uVar3 & 0x1f) & 1) != 0) |
           (&b_01[1].width)[uVar5] & 0xfffffffe;
      pBVar4 = btorsim_bv_ult(b,b_01);
      if (pBVar4->width == 1) {
        uVar2 = (&pBVar4[1].width)[pBVar4->len - 1];
        free(pBVar4);
        if ((uVar2 & 1) == 0) goto LAB_00114ffc;
LAB_00115024:
        pBVar4 = btorsim_bv_add(b_01,b_00);
        free(b_01);
        (&local_58[1].width)[uVar8 + local_58->len] =
             (&local_58[1].width)[uVar8 + local_58->len] | 1 << ((byte)uVar3 & 0x1f);
        b_01 = pBVar4;
      }
      else {
        free(pBVar4);
LAB_00114ffc:
        pBVar4 = btorsim_bv_eq(b,b_01);
        if (pBVar4->width == 1) {
          uVar2 = (&pBVar4[1].width)[pBVar4->len - 1];
          free(pBVar4);
          if ((uVar2 & 1) != 0) goto LAB_00115024;
        }
        else {
          free(pBVar4);
        }
      }
      bVar1 = 0 < (long)uVar3;
      pBVar4 = b_01;
      uVar3 = uVar3 - 1;
    } while (bVar1);
    free(b_00);
  }
  if (q == (BtorSimBitVector **)0x0) {
    free(local_58);
  }
  else {
    *q = local_58;
  }
  if (r == (BtorSimBitVector **)0x0) {
    free(b_01);
    return;
  }
  *r = b_01;
  return;
}

Assistant:

static void
udiv_urem_bv (const BtorSimBitVector *a,
              const BtorSimBitVector *b,
              BtorSimBitVector **q,
              BtorSimBitVector **r)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  int64_t i;
  bool is_true;
  uint64_t x, y, z;

  BtorSimBitVector *neg_b, *quot, *rem, *ult, *eq, *tmp;

  if (a->width <= 64)
  {
    x = btorsim_bv_to_uint64 (a);
    y = btorsim_bv_to_uint64 (b);
    if (y == 0)
    {
      y = x;
      x = UINT64_MAX;
    }
    else
    {
      z = x / y;
      y = x % y;
      x = z;
    }
    quot = btorsim_bv_uint64_to_bv (x, a->width);
    rem  = btorsim_bv_uint64_to_bv (y, a->width);
  }
  else
  {
    neg_b = btorsim_bv_neg (b);
    quot  = btorsim_bv_new (a->width);
    rem   = btorsim_bv_new (a->width);

    for (i = a->width - 1; i >= 0; i--)
    {
      tmp = sll_bv (rem, 1);
      free (rem);
      rem = tmp;
      btorsim_bv_set_bit (rem, 0, btorsim_bv_get_bit (a, i));

      ult     = btorsim_bv_ult (b, rem);
      is_true = btorsim_bv_is_true (ult);
      free (ult);

      if (is_true) goto UDIV_UREM_SUBTRACT;

      eq      = btorsim_bv_eq (b, rem);
      is_true = btorsim_bv_is_true (eq);
      free (eq);

      if (is_true)
      {
      UDIV_UREM_SUBTRACT:
        tmp = btorsim_bv_add (rem, neg_b);
        free (rem);
        rem = tmp;
        btorsim_bv_set_bit (quot, i, 1);
      }
    }
    free (neg_b);
  }

  if (q)
    *q = quot;
  else
    free (quot);

  if (r)
    *r = rem;
  else
    free (rem);
}